

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

void * __thiscall eastl::allocator::allocate(allocator *this,size_t n,int flags)

{
  void *pvVar1;
  int flags_local;
  size_t n_local;
  allocator *this_local;
  
  pvVar1 = operator_new__(n,(char *)0x0,flags,0,(char *)0x0,0);
  return pvVar1;
}

Assistant:

inline void* allocator::allocate(size_t n, int flags)
        {
#  if EASTL_NAME_ENABLED
#    define pName mpName
#  else
#    define pName EASTL_ALLOCATOR_DEFAULT_NAME
#  endif

#  if EASTL_DLL
                // We currently have no support for implementing flags when 
                // using the C runtime library operator new function. The user 
                // can use SetDefaultAllocator to override the default allocator.
                (void)flags;
                return ::new char[n];
#  elif (EASTL_DEBUGPARAMS_LEVEL <= 0)
                return ::new((char*)0, flags, 0, (char*)0,        0) char[n];
#  elif (EASTL_DEBUGPARAMS_LEVEL == 1)
                return ::new(   pName, flags, 0, (char*)0,        0) char[n];
#  else
                return ::new(   pName, flags, 0, __FILE__, __LINE__) char[n];
#  endif
        }